

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 uVar3;
  Command *pCVar4;
  _Elt_pointer pbVar5;
  bool bVar6;
  int iVar7;
  basic_ostream<char,_std::char_traits<char>_> *pbVar8;
  char *pcVar9;
  ostream *poVar10;
  ulong extraout_RDX;
  array<Command,_7UL> *paVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  _Map_pointer ppbVar14;
  optional<std::pair<int,_int>_> location;
  int aliasIndex;
  string argFile;
  __string_type args;
  string currentFile;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  string cmdString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> arg;
  stringstream joinedArgs;
  ofstream qfOS;
  undefined4 local_7c4;
  Command *local_7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b8;
  string local_798;
  string local_778;
  _Any_data local_758;
  code *local_748;
  code *pcStack_740;
  long *local_730 [2];
  long local_720 [2];
  undefined1 *local_710;
  undefined8 local_708;
  undefined1 local_700;
  undefined7 uStack_6ff;
  undefined1 local_6f0 [32];
  _Alloc_hider local_6d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6c0;
  _Alloc_hider local_6b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6a0;
  bool local_690;
  string local_688;
  string local_668;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_648;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5e8;
  string local_5d8;
  undefined1 local_5b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a8 [14];
  ios_base aiStack_4c0 [264];
  stringstream local_3b8 [16];
  basic_ostream<char,_std::char_traits<char>_> local_3a8 [112];
  ios_base local_338 [264];
  _Quoted_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  local_230 [15];
  ios_base aiStack_138 [264];
  
  local_648.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_648.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_648.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_648.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_648.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_648.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_648.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_648.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_648.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_648.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::_M_range_initialize<char**>
            ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_648,argv + 1
             ,argv + argc);
  if (local_648.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_648.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
LAB_001063be:
    helpAndExit();
  }
  local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b8,"/tmp/tag_aliases","");
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (local_648.
                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur,"--alias-file");
  if (iVar7 == 0) {
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(&local_648);
    popFirst((string *)local_5b8,&local_648);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_7b8,(string *)local_5b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b8._0_8_ != local_5a8) {
      operator_delete((void *)local_5b8._0_8_,local_5a8[0]._M_allocated_capacity + 1);
    }
  }
  popFirst((string *)&local_5f8,&local_648);
  paVar11 = &COMMANDS;
  local_5b8._0_8_ = &local_5f8;
  bVar6 = __gnu_cxx::__ops::_Iter_pred<main::$_0>::operator()
                    ((_Iter_pred<main::__0> *)local_5b8,COMMANDS._M_elems);
  if (!bVar6) {
    paVar11 = (array<Command,_7UL> *)(COMMANDS._M_elems + 1);
    bVar6 = __gnu_cxx::__ops::_Iter_pred<main::$_0>::operator()
                      ((_Iter_pred<main::__0> *)local_5b8,COMMANDS._M_elems + 1);
    if (!bVar6) {
      paVar11 = (array<Command,_7UL> *)(COMMANDS._M_elems + 2);
      bVar6 = __gnu_cxx::__ops::_Iter_pred<main::$_0>::operator()
                        ((_Iter_pred<main::__0> *)local_5b8,COMMANDS._M_elems + 2);
      if (!bVar6) {
        paVar11 = (array<Command,_7UL> *)(COMMANDS._M_elems + 3);
        bVar6 = __gnu_cxx::__ops::_Iter_pred<main::$_0>::operator()
                          ((_Iter_pred<main::__0> *)local_5b8,COMMANDS._M_elems + 3);
        if (!bVar6) {
          paVar11 = (array<Command,_7UL> *)(COMMANDS._M_elems + 4);
          bVar6 = __gnu_cxx::__ops::_Iter_pred<main::$_0>::operator()
                            ((_Iter_pred<main::__0> *)local_5b8,COMMANDS._M_elems + 4);
          if (!bVar6) {
            paVar11 = (array<Command,_7UL> *)(COMMANDS._M_elems + 5);
            bVar6 = __gnu_cxx::__ops::_Iter_pred<main::$_0>::operator()
                              ((_Iter_pred<main::__0> *)local_5b8,COMMANDS._M_elems + 5);
            if (!bVar6) {
              bVar6 = __gnu_cxx::__ops::_Iter_pred<main::$_0>::operator()
                                ((_Iter_pred<main::__0> *)local_5b8,COMMANDS._M_elems + 6);
              paVar11 = (array<Command,_7UL> *)
                        &std::__detail::
                         _AnyMatcher<std::__cxx11::regex_traits<char>,_false,_false,_false>::
                         operator()::__nul;
              if (bVar6) {
                paVar11 = (array<Command,_7UL> *)(COMMANDS._M_elems + 6);
              }
            }
          }
        }
      }
    }
  }
  local_7c0 = paVar11->_M_elems;
  if (paVar11 ==
      (array<Command,_7UL> *)
      &std::__detail::_AnyMatcher<std::__cxx11::regex_traits<char>,_false,_false,_false>::operator()
       ::__nul) goto LAB_001063be;
  std::__cxx11::stringstream::stringstream(local_3b8);
  pbVar5 = local_648.
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_648.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur !=
      local_648.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    pbVar12 = local_648.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
    pbVar13 = local_648.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppbVar14 = local_648.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      pcVar1 = (pbVar12->_M_dataplus)._M_p;
      local_5b8._0_8_ = local_5a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_5b8,pcVar1,pcVar1 + pbVar12->_M_string_length);
      local_230[0]._M_delim = '\"';
      local_230[0]._M_escape = '\\';
      local_230[0]._M_string =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b8;
      pbVar8 = std::__detail::operator<<(local_3a8,local_230);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar8," ",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._0_8_ != local_5a8) {
        operator_delete((void *)local_5b8._0_8_,local_5a8[0]._M_allocated_capacity + 1);
      }
      pbVar12 = pbVar12 + 1;
      if (pbVar12 == pbVar13) {
        pbVar12 = ppbVar14[1];
        ppbVar14 = ppbVar14 + 1;
        pbVar13 = pbVar12 + 0x10;
      }
    } while (pbVar12 != pbVar5);
  }
  std::__cxx11::stringbuf::str();
  iVar7 = fileno(_stdout);
  iVar7 = isatty(iVar7);
  if (iVar7 == 0) {
    pcVar9 = getenv("SKIP_PIPE_FILTERING");
    if (pcVar9 == (char *)0x0) {
      iVar7 = Command::runWithoutDefaultArgs(local_7c0,&local_778);
      goto LAB_001062cb;
    }
  }
  pCVar4 = local_7c0;
  local_6f0._0_8_ = local_6f0 + 0x10;
  pcVar1 = (local_7c0->cmd_id_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_6f0,pcVar1,pcVar1 + (local_7c0->cmd_id_)._M_string_length);
  local_6d0._M_p = (pointer)&local_6c0;
  pcVar1 = (pCVar4->cmd_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_6d0,pcVar1,pcVar1 + (pCVar4->cmd_)._M_string_length);
  local_6b0._M_p = (pointer)&local_6a0;
  pcVar1 = (pCVar4->extraArgs_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_6b0,pcVar1,pcVar1 + (pCVar4->extraArgs_)._M_string_length);
  local_690 = pCVar4->includeFiles_;
  local_730[0] = local_720;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_730,local_7b8._M_dataplus._M_p,
             local_7b8._M_dataplus._M_p + local_7b8._M_string_length);
  local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_798,local_778._M_dataplus._M_p,
             local_778._M_dataplus._M_p + local_778._M_string_length);
  local_710 = &local_700;
  local_708 = 0;
  local_700 = 0;
  local_7c4 = 1;
  std::ofstream::ofstream((ofstream *)local_5b8,(string *)local_730,_S_out);
  std::ofstream::ofstream((ofstream *)local_230,(string *)&QF_FILE_abi_cxx11_,_S_out);
  local_668.field_2._M_allocated_capacity._0_4_ = 0x6c6c61;
  local_668._M_string_length = 3;
  local_688.field_2._M_allocated_capacity._0_4_ = 0x20712d;
  local_688._M_string_length = 3;
  location.super__Optional_base<std::pair<int,_int>,_true,_true>._M_payload.
  super__Optional_payload_base<std::pair<int,_int>_>._8_4_ = 0;
  location.super__Optional_base<std::pair<int,_int>,_true,_true>._M_payload.
  super__Optional_payload_base<std::pair<int,_int>_>._M_payload =
       (_Storage<std::pair<int,_int>,_true>)extraout_RDX;
  local_688._M_dataplus._M_p = (pointer)&local_688.field_2;
  local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
  vimEditCommand(&local_5d8,&QF_FILE_abi_cxx11_,location,&local_688);
  aliasForCommand((string *)&local_758,&local_668,&local_5d8);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_5b8,(char *)local_758._M_unused._0_8_,local_758._8_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  if ((code **)local_758._M_unused._0_8_ != &local_748) {
    operator_delete(local_758._M_unused._M_object,(ulong)(local_748 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_688._M_dataplus._M_p != &local_688.field_2) {
    operator_delete(local_688._M_dataplus._M_p,
                    CONCAT44(local_688.field_2._M_allocated_capacity._4_4_,
                             local_688.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_668._M_dataplus._M_p != &local_668.field_2) {
    operator_delete(local_668._M_dataplus._M_p,
                    CONCAT44(local_668.field_2._M_allocated_capacity._4_4_,
                             local_668.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_758._M_unused._M_object = (void *)0x0;
  local_758._8_8_ = 0;
  local_748 = (code *)0x0;
  pcStack_740 = (code *)0x0;
  local_758._M_unused._M_object = operator_new(0x28);
  *(undefined1 ***)local_758._M_unused._0_8_ = &local_710;
  *(ofstream **)((long)local_758._M_unused._0_8_ + 8) = (ofstream *)local_5b8;
  *(undefined4 **)((long)local_758._M_unused._0_8_ + 0x10) = &local_7c4;
  *(_Quoted_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
    **)((long)local_758._M_unused._0_8_ + 0x18) = local_230;
  *(Command **)((long)local_758._M_unused._0_8_ + 0x20) = (Command *)local_6f0;
  pcStack_740 = std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/keith[P]tag/tag.cpp:173:24)>
                ::_M_invoke;
  local_748 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/keith[P]tag/tag.cpp:173:24)>
              ::_M_manager;
  iVar7 = Command::run((Command *)local_6f0,&local_798,
                       (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_758);
  if (local_748 != (code *)0x0) {
    (*local_748)(&local_758,&local_758,3);
  }
  uVar3 = __filebuf;
  paVar2 = _VTT;
  local_230[0]._M_string = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_VTT
  ;
  *(undefined8 *)((long)&local_230[0]._M_string + *(size_type *)(_VTT->_M_local_buf + -0x18)) =
       __filebuf;
  std::filebuf::~filebuf((filebuf *)&local_230[0]._M_delim);
  std::ios_base::~ios_base(aiStack_138);
  local_5b8._0_8_ = paVar2;
  *(undefined8 *)(local_5b8 + *(size_type *)(paVar2->_M_local_buf + -0x18)) = uVar3;
  std::filebuf::~filebuf((filebuf *)(local_5b8 + 8));
  std::ios_base::~ios_base(aiStack_4c0);
  if (local_710 != &local_700) {
    operator_delete(local_710,CONCAT71(uStack_6ff,local_700) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_798._M_dataplus._M_p != &local_798.field_2) {
    operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
  }
  if (local_730[0] != local_720) {
    operator_delete(local_730[0],local_720[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b0._M_p != &local_6a0) {
    operator_delete(local_6b0._M_p,local_6a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d0._M_p != &local_6c0) {
    operator_delete(local_6d0._M_p,local_6c0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_6f0._0_8_ != local_6f0 + 0x10) {
    operator_delete((void *)local_6f0._0_8_,local_6f0._16_8_ + 1);
  }
LAB_001062cb:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_778._M_dataplus._M_p != &local_778.field_2) {
    operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_3b8);
  std::ios_base::~ios_base(local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_allocated_capacity != &local_5e8) {
    operator_delete((void *)local_5f8._M_allocated_capacity,local_5e8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
    operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&local_648);
  return iVar7;
}

Assistant:

int main(int argc, char *argv[]) {
  std::deque<std::string> arguments(argv + 1, argv + argc);
  if (arguments.empty())
    helpAndExit();

  std::string argFile("/tmp/tag_aliases");
  if (arguments.front() == "--alias-file") {
    arguments.pop_front();
    argFile = popFirst(arguments);
  }

  let cmdString = popFirst(arguments);
  let *command =
      std::find_if(COMMANDS.begin(), COMMANDS.end(), [&cmdString](auto &cmd) {
        return cmdString == cmd.cmd_id();
      });

  if (command == COMMANDS.end())
    helpAndExit();

  std::stringstream joinedArgs;
  for (auto arg : arguments) {
    joinedArgs << std::quoted(arg) << " ";
  }

  let args = joinedArgs.str();
  let isPiped = !isatty(fileno(stdout));
  if (isPiped && std::getenv("SKIP_PIPE_FILTERING") == nullptr)
    return command->runWithoutDefaultArgs(args);

  return runAndWriteFile(*command, argFile, args);
}